

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  this->CircleVtx12[10].x = 0.0;
  this->CircleVtx12[10].y = 0.0;
  this->CircleVtx12[0xb].x = 0.0;
  this->CircleVtx12[0xb].y = 0.0;
  this->CircleVtx12[8].x = 0.0;
  this->CircleVtx12[8].y = 0.0;
  this->CircleVtx12[9].x = 0.0;
  this->CircleVtx12[9].y = 0.0;
  this->CircleVtx12[6].x = 0.0;
  this->CircleVtx12[6].y = 0.0;
  this->CircleVtx12[7].x = 0.0;
  this->CircleVtx12[7].y = 0.0;
  this->CircleVtx12[4].x = 0.0;
  this->CircleVtx12[4].y = 0.0;
  this->CircleVtx12[5].x = 0.0;
  this->CircleVtx12[5].y = 0.0;
  this->CircleVtx12[2].x = 0.0;
  this->CircleVtx12[2].y = 0.0;
  this->CircleVtx12[3].x = 0.0;
  this->CircleVtx12[3].y = 0.0;
  this->CircleVtx12[0].x = 0.0;
  this->CircleVtx12[0].y = 0.0;
  this->CircleVtx12[1].x = 0.0;
  this->CircleVtx12[1].y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->CurveTessellationTol = 0.0;
  (this->ClipRectFullscreen).x = -8192.0;
  (this->ClipRectFullscreen).y = -8192.0;
  (this->ClipRectFullscreen).z = 8192.0;
  (this->ClipRectFullscreen).w = 8192.0;
  this->InitialFlags = 0;
  lVar1 = 0;
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 12.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->CircleVtx12[lVar1].x = fVar3;
    this->CircleVtx12[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    Font = NULL;
    FontSize = 0.0f;
    CurveTessellationTol = 0.0f;
    ClipRectFullscreen = ImVec4(-8192.0f, -8192.0f, +8192.0f, +8192.0f);
    InitialFlags = ImDrawListFlags_None;

    // Const data
    for (int i = 0; i < IM_ARRAYSIZE(CircleVtx12); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(CircleVtx12);
        CircleVtx12[i] = ImVec2(ImCos(a), ImSin(a));
    }
}